

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O3

void __thiscall
IceMaths::Point::ProjectToScreen
          (Point *this,float halfrenderwidth,float halfrenderheight,Matrix4x4 *mat,HPoint *projected
          )

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  HPoint local_30;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_30.super_Point.z = this->z;
  local_30.super_Point.x = this->x;
  local_30.super_Point.y = this->y;
  local_30.w = 1.0;
  HPoint::operator*(&local_30,mat);
  (projected->super_Point).x = (float)(undefined4)local_20;
  (projected->super_Point).y = (float)local_20._4_4_;
  *(undefined8 *)&(projected->super_Point).z = uStack_18;
  fVar3 = 1.0 / projected->w;
  projected->w = fVar3;
  (projected->super_Point).z = (projected->super_Point).z * fVar3;
  uVar1 = (projected->super_Point).x;
  uVar2 = (projected->super_Point).y;
  (projected->super_Point).x = halfrenderwidth + fVar3 * (float)uVar1 * halfrenderwidth;
  (projected->super_Point).y = halfrenderheight - fVar3 * (float)uVar2 * halfrenderheight;
  return;
}

Assistant:

void Point::ProjectToScreen(float halfrenderwidth, float halfrenderheight, const Matrix4x4& mat, HPoint& projected) const
{
	projected = HPoint(x, y, z, 1.0f) * mat;
	projected.w = 1.0f / projected.w;

	projected.x*=projected.w;
	projected.y*=projected.w;
	projected.z*=projected.w;

	projected.x *= halfrenderwidth;		projected.x += halfrenderwidth;
	projected.y *= -halfrenderheight;	projected.y += halfrenderheight;
}